

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O1

bool __thiscall
GraphContigger::solve_tip(GraphContigger *this,TangleView *t,Strider *s,GraphEditor *ge)

{
  pointer pNVar1;
  pointer plVar2;
  pointer plVar3;
  pointer plVar4;
  bool bVar5;
  SequenceDistanceGraphPath local_58;
  
  Strider::stride_out_in_order
            (&local_58,s,
             -((t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
               super__Vector_impl_data._M_start)->id,true,true,false);
  plVar4 = local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  plVar3 = local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  plVar2 = local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  Strider::stride_out_in_order
            (&local_58,s,
             -(t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start[1].id,true,true,false);
  if (((((ulong)((long)plVar3 - (long)plVar2) < 9) ||
       (pNVar1 = (t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                 super__Vector_impl_data._M_start, plVar2[1] != pNVar1[1].id)) ||
      ((ulong)((long)local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start) < 9)) ||
     (local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_start[1] != pNVar1->id)) {
    bVar5 = false;
  }
  else {
    bVar5 = GraphEditor::queue_node_deletion
                      (ge,((t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id);
  }
  if (local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)plVar4 - (long)plVar2);
  }
  return bVar5;
}

Assistant:

bool GraphContigger::solve_tip(TangleView &t, Strider &s, GraphEditor &ge){
    //just check that each frontier connects to the other one through reads
    auto f0s = s.stride_out_in_order(-t.frontiers[0].node_id()).nodes;
    auto f1s = s.stride_out_in_order(-t.frontiers[1].node_id()).nodes;
    if (f0s.size()>1 and f0s[1]==t.frontiers[1].node_id() and f1s.size()>1 and f1s[1]==t.frontiers[0].node_id()){
        return ge.queue_node_deletion(t.internals[0].node_id());
    }
    return false;
}